

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O0

int __thiscall
UnifiedRegex::SyncToLiteralAndConsumeInstT<UnifiedRegex::Char2LiteralScannerMixin>::Print
          (SyncToLiteralAndConsumeInstT<UnifiedRegex::Char2LiteralScannerMixin> *this,DebugWriter *w
          ,Label label,Char *litbuf)

{
  Char *litbuf_local;
  Label label_local;
  DebugWriter *w_local;
  SyncToLiteralAndConsumeInstT<UnifiedRegex::Char2LiteralScannerMixin> *this_local;
  
  DebugWriter::Print(w,L"L%04x: ",(ulong)label);
  if ((DAT_01ec73dd & 1) != 0) {
    DebugWriter::Print(w,L"(0x%03x bytes) ",5);
  }
  DebugWriter::Print(w,
                     L"SyncToLiteralAndConsumeInstT<Char2LiteralScannerMixin> aka SyncToChar2LiteralAndConsume"
                    );
  DebugWriter::Print(w,L"(");
  Char2LiteralScannerMixin::Print(&this->super_Char2LiteralScannerMixin,w,litbuf);
  DebugWriter::PrintEOL(w,L")");
  if ((DAT_01ec73dd & 1) != 0) {
    DebugWriter::Indent(w);
    Inst::PrintBytes<UnifiedRegex::Inst>
              (&this->super_Inst,w,&this->super_Inst,&this->super_Inst,L"Inst");
    Inst::PrintBytes<UnifiedRegex::Char2LiteralScannerMixin>
              (&this->super_Inst,w,&this->super_Inst,&this->super_Char2LiteralScannerMixin,
               L"Char2LiteralScannerMixin");
    DebugWriter::Unindent(w);
  }
  return 5;
}

Assistant:

int SyncToLiteralAndConsumeInstT<Char2LiteralScannerMixin>::Print(DebugWriter* w, Label label, const Char* litbuf) const
    {
        // NOTE: this text is unique to this instantiation
        PRINT_RE_BYTECODE_BEGIN("SyncToLiteralAndConsumeInstT<Char2LiteralScannerMixin> aka SyncToChar2LiteralAndConsume");
        PRINT_MIXIN(Char2LiteralScannerMixin); // NOTE: would work with template <typename ScannerT> ScannerT::Print
        PRINT_RE_BYTECODE_MID();
        PRINT_BYTES(Char2LiteralScannerMixin); // NOTE: unique because macro expansion and _u(#InstType) happen before template is evaluated (so text would be ScannerT)
        PRINT_RE_BYTECODE_END();
    }